

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# object_info.h
# Opt level: O2

void __thiscall NamesAndLabels::~NamesAndLabels(NamesAndLabels *this)

{
  std::_Vector_base<XrDebugUtilsLabelEXT,_std::allocator<XrDebugUtilsLabelEXT>_>::~_Vector_base
            (&(this->labels).
              super__Vector_base<XrDebugUtilsLabelEXT,_std::allocator<XrDebugUtilsLabelEXT>_>);
  std::_Vector_base<XrDebugUtilsObjectNameInfoEXT,_std::allocator<XrDebugUtilsObjectNameInfoEXT>_>::
  ~_Vector_base(&(this->objects).
                 super__Vector_base<XrDebugUtilsObjectNameInfoEXT,_std::allocator<XrDebugUtilsObjectNameInfoEXT>_>
               );
  std::vector<XrSdkLogObjectInfo,_std::allocator<XrSdkLogObjectInfo>_>::~vector(&this->sdk_objects);
  return;
}

Assistant:

NamesAndLabels() = default;